

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall wabt::TypeChecker::OnIndexedFuncRef(TypeChecker *this,Index *out_index)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  Type in_RAX;
  Type expected;
  Index IVar4;
  Type type;
  Type local_38;
  
  local_38 = in_RAX;
  RVar1 = PeekType(this,0,&local_38);
  IVar4 = 0xffffffff;
  if (local_38.enum_ == Reference) {
    IVar4 = local_38.type_index_;
  }
  expected.enum_ = Reference;
  expected.type_index_ = 0xffffffff;
  if (local_38.enum_ == Reference) {
    expected = local_38;
  }
  RVar2 = PopAndCheck1Type(this,expected,"call_ref");
  if (RVar2.enum_ != Error && RVar1.enum_ != Error) {
    *out_index = IVar4;
  }
  RVar3.enum_._1_3_ = 0;
  RVar3.enum_._0_1_ = RVar2.enum_ == Error || RVar1.enum_ == Error;
  return (Result)RVar3.enum_;
}

Assistant:

Result TypeChecker::OnIndexedFuncRef(Index* out_index) {
  Type type;
  Result result = PeekType(0, &type);
  if (!type.IsReferenceWithIndex()) {
    type = Type(Type::Reference, kInvalidIndex);
  }
  result |= PopAndCheck1Type(type, "call_ref");
  if (Succeeded(result)) {
    *out_index = type.GetReferenceIndex();
  }
  return result;
}